

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::VarStmt::~VarStmt(VarStmt *this)

{
  VarStmt *this_local;
  
  ~VarStmt(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

VarStmt(Variable var, uint64_t line, bool is_decl)
        : Scope<VarStmt>(line), var_(std::move(var)), is_decl_(is_decl) {}